

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::
OnCallSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Matches(OnCallSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<std::__cxx11::string_const&>>,std::tuple<std::__cxx11::string_const&>>
                    ((tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_&>
            ::Matches((MatcherBase<const_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_&>
                       *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }